

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

QByteArray *
qGssapiContinue(QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *ctx,
               QByteArrayView challenge)

{
  undefined4 uVar1;
  undefined4 uVar2;
  OM_uint32 stat;
  uint stat_00;
  long *plVar3;
  QGssApiHandles *pQVar4;
  long in_FS_OFFSET;
  gss_buffer_desc inBuf;
  QByteArray local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  long local_48;
  storage_type *psStack_40;
  undefined4 local_30;
  OM_uint32 local_2c;
  QByteArray *local_28;
  
  local_28 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48 = 0;
  psStack_40 = (storage_type *)0x0;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  if (challenge.m_size == 0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = &local_48;
    local_48 = challenge.m_size;
    psStack_40 = challenge.m_data;
  }
  local_2c = 0xaaaaaaaa;
  local_30 = 0xaaaaaaaa;
  pQVar4 = (ctx->gssApiHandles).d;
  stat_00 = gss_init_sec_context
                      (&local_2c,0,pQVar4,pQVar4->targetName,0,2,0,0,plVar3,0,&local_58,0,0);
  if (CONCAT44(uStack_54,local_58) != 0) {
    QByteArray::QByteArray
              (&local_78,(char *)CONCAT44(uStack_4c,uStack_50),CONCAT44(uStack_54,local_58));
    uVar1 = local_78.d.d._0_4_;
    uVar2 = local_78.d.d._4_4_;
    local_78.d.d = (Data *)0x0;
    *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar2;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_78.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_78.d.ptr._4_4_;
    local_78.d.ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = local_78.d.size;
  }
  gss_release_buffer(&local_30,&local_58);
  stat = local_2c;
  if (stat_00 < 2) {
    if (stat_00 != 0) goto LAB_001a6859;
    gss_release_name(&local_30,&((ctx->gssApiHandles).d)->targetName);
LAB_001a6835:
    pQVar4 = (ctx->gssApiHandles).d;
    if (pQVar4 == (QGssApiHandles *)0x0) goto LAB_001a6859;
  }
  else {
    q_GSSAPI_error_int("gss_init_sec_context error",stat_00,1);
    q_GSSAPI_error_int("gss_init_sec_context error",stat,2);
    gss_release_name(&local_30,&((ctx->gssApiHandles).d)->targetName);
    pQVar4 = (ctx->gssApiHandles).d;
    if (pQVar4->gssCtx != (gss_ctx_id_t)0x0) {
      gss_delete_sec_context(&local_30,pQVar4,0);
      goto LAB_001a6835;
    }
  }
  (ctx->gssApiHandles).d = (QGssApiHandles *)0x0;
  operator_delete(pQVar4,0x10);
LAB_001a6859:
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(QByteArray **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qGssapiContinue(QAuthenticatorPrivate *ctx, QByteArrayView challenge)
{
    OM_uint32 majStat, minStat, ignored;
    QByteArray result;
    gss_buffer_desc inBuf = {0, nullptr}; // GSS input token
    gss_buffer_desc outBuf; // GSS output token

    if (!challenge.isEmpty()) {
        inBuf.value = const_cast<char*>(challenge.data());
        inBuf.length = challenge.size();
    }

    majStat = gss_init_sec_context(&minStat,
                                   GSS_C_NO_CREDENTIAL,
                                   &ctx->gssApiHandles->gssCtx,
                                   ctx->gssApiHandles->targetName,
                                   GSS_C_NO_OID,
                                   GSS_C_MUTUAL_FLAG,
                                   0,
                                   GSS_C_NO_CHANNEL_BINDINGS,
                                   challenge.isEmpty() ? GSS_C_NO_BUFFER : &inBuf,
                                   nullptr,
                                   &outBuf,
                                   nullptr,
                                   nullptr);

    if (outBuf.length != 0)
        result = QByteArray(reinterpret_cast<const char*>(outBuf.value), outBuf.length);
    gss_release_buffer(&ignored, &outBuf);

    if (majStat != GSS_S_COMPLETE && majStat != GSS_S_CONTINUE_NEEDED) {
        q_GSSAPI_error("gss_init_sec_context error", majStat, minStat);
        gss_release_name(&ignored, &ctx->gssApiHandles->targetName);
        if (ctx->gssApiHandles->gssCtx)
            gss_delete_sec_context(&ignored, &ctx->gssApiHandles->gssCtx, GSS_C_NO_BUFFER);
        ctx->gssApiHandles.reset(nullptr);
    }

    if (majStat == GSS_S_COMPLETE) {
        gss_release_name(&ignored, &ctx->gssApiHandles->targetName);
        ctx->gssApiHandles.reset(nullptr);
    }

    return result;
}